

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_draw_list_fill_poly_convex
               (nk_draw_list *list,nk_vec2 *points,uint points_count,nk_color color,
               nk_anti_aliasing aliasing)

{
  nk_convert_config *config;
  undefined8 uVar1;
  undefined8 uVar2;
  nk_vec2 uv;
  void *pvVar3;
  void *pvVar4;
  nk_vec2 pos;
  nk_vec2 pos_00;
  void *pvVar5;
  nk_draw_index *pnVar6;
  void *pvVar7;
  nk_draw_index nVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  nk_draw_index nVar15;
  float fVar16;
  nk_draw_index nVar17;
  uint uVar18;
  bool bVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  nk_colorf color_00;
  nk_colorf color_01;
  nk_colorf color_02;
  nk_size index;
  nk_colorf col;
  
  if (list == (nk_draw_list *)0x0) {
    __assert_fail("list",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x2691,
                  "void nk_draw_list_fill_poly_convex(struct nk_draw_list *, const struct nk_vec2 *, const unsigned int, struct nk_color, enum nk_anti_aliasing)"
                 );
  }
  if (2 < points_count) {
    config = &list->config;
    nk_color_fv(&col.r,(nk_color)
                       ((uint)color & 0xffffff |
                       (int)((float)((uint)color >> 0x18) * (list->config).global_alpha) << 0x18));
    uVar18 = list->vertex_count;
    nVar15 = (nk_draw_index)uVar18;
    if (aliasing == NK_ANTI_ALIASING_ON) {
      pvVar5 = nk_draw_list_alloc_vertices(list,(ulong)(points_count * 2));
      pnVar6 = nk_draw_list_alloc_elements(list,(ulong)(points_count * 9 - 6));
      if (pnVar6 != (nk_draw_index *)0x0 && pvVar5 != (void *)0x0) {
        pvVar3 = (list->vertices->memory).ptr;
        nk_buffer_mark(list->vertices,NK_BUFFER_FRONT);
        uVar13 = (ulong)points_count;
        pvVar7 = nk_buffer_alloc(list->vertices,NK_BUFFER_FRONT,uVar13 * 8,4);
        if (pvVar7 != (void *)0x0) {
          pvVar4 = (list->vertices->memory).ptr;
          lVar10 = uVar13 - 2;
          iVar14 = uVar18 + 2;
          while (bVar19 = lVar10 != 0, lVar10 = lVar10 + -1, bVar19) {
            *pnVar6 = nVar15;
            pnVar6[1] = (nk_draw_index)iVar14;
            iVar14 = iVar14 + 2;
            pnVar6[2] = (nk_draw_index)iVar14;
            pnVar6 = pnVar6 + 3;
          }
          uVar11 = (ulong)(points_count - 1);
          for (uVar12 = 0; uVar13 != uVar12; uVar12 = uVar12 + 1) {
            fVar21 = points[uVar12].x - points[uVar11].x;
            fVar20 = points[uVar12].y - points[uVar11].y;
            fVar22 = fVar21 * fVar21 + fVar20 * fVar20;
            fVar16 = 1.0;
            if ((fVar22 != 0.0) || (NAN(fVar22))) {
              fVar16 = (float)(0x5f375a84 - ((uint)fVar22 >> 1));
              fVar16 = (fVar22 * -0.5 * fVar16 * fVar16 + 1.5) * fVar16;
            }
            *(ulong *)((long)pvVar7 + uVar11 * 8) = CONCAT44(fVar16 * -fVar21,fVar16 * fVar20);
            uVar11 = uVar12;
          }
          pvVar5 = (void *)((long)pvVar5 + ((long)pvVar4 - (long)pvVar3));
          uVar11 = 0;
          uVar12 = (ulong)(points_count - 1);
          while (uVar9 = uVar11, uVar13 != uVar9) {
            uVar1 = *(undefined8 *)((long)pvVar7 + uVar12 * 8);
            uVar2 = *(undefined8 *)((long)pvVar7 + uVar9 * 8);
            fVar20 = ((float)uVar2 + (float)uVar1) * 0.5;
            fVar21 = ((float)((ulong)uVar2 >> 0x20) + (float)((ulong)uVar1 >> 0x20)) * 0.5;
            fVar16 = fVar20 * fVar20 + fVar21 * fVar21;
            if (1e-06 < fVar16) {
              fVar16 = 1.0 / fVar16;
              if (100.0 <= fVar16) {
                fVar16 = 100.0;
              }
              fVar20 = fVar20 * fVar16;
              fVar21 = fVar21 * fVar16;
            }
            uv = (list->config).null.uv;
            color_01.b = col.b;
            color_01.a = col.a;
            color_01.r = col.r;
            color_01.g = col.g;
            pos.y = points[uVar9].y - fVar21 * 0.5;
            pos.x = points[uVar9].x - fVar20 * 0.5;
            pvVar5 = nk_draw_vertex(pvVar5,config,pos,uv,color_01);
            color_02.b = (float)(int)(col._8_8_ & 0xffffffff);
            color_02.a = (float)(int)((col._8_8_ & 0xffffffff) >> 0x20);
            color_02.r = col.r;
            color_02.g = col.g;
            pos_00.y = points[uVar9].y + fVar21 * 0.5;
            pos_00.x = points[uVar9].x + fVar20 * 0.5;
            pvVar5 = nk_draw_vertex(pvVar5,config,pos_00,uv,color_02);
            nVar17 = (nk_draw_index)uVar18;
            *pnVar6 = nVar17;
            pnVar6[1] = nVar15 + (short)uVar12 * 2;
            nVar8 = nVar15 + 1 + (short)uVar12 * 2;
            pnVar6[2] = nVar8;
            pnVar6[3] = nVar8;
            pnVar6[4] = nVar17 + 1;
            pnVar6[5] = nVar17;
            pnVar6 = pnVar6 + 6;
            uVar18 = uVar18 + 2;
            uVar12 = uVar9;
            uVar11 = uVar9 + 1;
          }
          nk_buffer_reset(list->vertices,NK_BUFFER_FRONT);
          return;
        }
      }
    }
    else {
      uVar13 = (ulong)points_count;
      pvVar5 = nk_draw_list_alloc_vertices(list,uVar13);
      pnVar6 = nk_draw_list_alloc_elements(list,(ulong)(points_count * 3 - 6));
      if (pnVar6 != (nk_draw_index *)0x0 && pvVar5 != (void *)0x0) {
        for (uVar11 = 0; uVar13 != uVar11; uVar11 = uVar11 + 1) {
          color_00.b = col.b;
          color_00.a = col.a;
          color_00.r = col.r;
          color_00.g = col.g;
          pvVar5 = nk_draw_vertex(pvVar5,config,points[uVar11],(list->config).null.uv,color_00);
        }
        iVar14 = uVar18 + 2;
        for (lVar10 = 0; uVar13 * 6 + -0xc != lVar10; lVar10 = lVar10 + 6) {
          *(nk_draw_index *)((long)pnVar6 + lVar10) = nVar15;
          *(short *)((long)pnVar6 + lVar10 + 2) = (short)iVar14 + -1;
          *(short *)((long)pnVar6 + lVar10 + 4) = (short)iVar14;
          iVar14 = iVar14 + 1;
        }
      }
    }
  }
  return;
}

Assistant:

NK_API void
nk_draw_list_fill_poly_convex(struct nk_draw_list *list,
    const struct nk_vec2 *points, const unsigned int points_count,
    struct nk_color color, enum nk_anti_aliasing aliasing)
{
    struct nk_colorf col;
    struct nk_colorf col_trans;

    NK_STORAGE const nk_size pnt_align = NK_ALIGNOF(struct nk_vec2);
    NK_STORAGE const nk_size pnt_size = sizeof(struct nk_vec2);
    NK_ASSERT(list);
    if (!list || points_count < 3) return;

#ifdef NK_INCLUDE_COMMAND_USERDATA
    nk_draw_list_push_userdata(list, list->userdata);
#endif

    color.a = (nk_byte)((float)color.a * list->config.global_alpha);
    nk_color_fv(&col.r, color);
    col_trans = col;
    col_trans.a = 0;

    if (aliasing == NK_ANTI_ALIASING_ON) {
        nk_size i = 0;
        nk_size i0 = 0;
        nk_size i1 = 0;

        const float AA_SIZE = 1.0f;
        nk_size vertex_offset = 0;
        nk_size index = list->vertex_count;

        const nk_size idx_count = (points_count-2)*3 + points_count*6;
        const nk_size vtx_count = (points_count*2);

        void *vtx = nk_draw_list_alloc_vertices(list, vtx_count);
        nk_draw_index *ids = nk_draw_list_alloc_elements(list, idx_count);

        nk_size size = 0;
        struct nk_vec2 *normals = 0;
        unsigned int vtx_inner_idx = (unsigned int)(index + 0);
        unsigned int vtx_outer_idx = (unsigned int)(index + 1);
        if (!vtx || !ids) return;

        /* temporary allocate normals */
        vertex_offset = (nk_size)((nk_byte*)vtx - (nk_byte*)list->vertices->memory.ptr);
        nk_buffer_mark(list->vertices, NK_BUFFER_FRONT);
        size = pnt_size * points_count;
        normals = (struct nk_vec2*) nk_buffer_alloc(list->vertices, NK_BUFFER_FRONT, size, pnt_align);
        if (!normals) return;
        vtx = (void*)((nk_byte*)list->vertices->memory.ptr + vertex_offset);

        /* add elements */
        for (i = 2; i < points_count; i++) {
            ids[0] = (nk_draw_index)(vtx_inner_idx);
            ids[1] = (nk_draw_index)(vtx_inner_idx + ((i-1) << 1));
            ids[2] = (nk_draw_index)(vtx_inner_idx + (i << 1));
            ids += 3;
        }

        /* compute normals */
        for (i0 = points_count-1, i1 = 0; i1 < points_count; i0 = i1++) {
            struct nk_vec2 p0 = points[i0];
            struct nk_vec2 p1 = points[i1];
            struct nk_vec2 diff = nk_vec2_sub(p1, p0);

            /* vec2 inverted length  */
            float len = nk_vec2_len_sqr(diff);
            if (len != 0.0f)
                len = nk_inv_sqrt(len);
            else len = 1.0f;
            diff = nk_vec2_muls(diff, len);

            normals[i0].x = diff.y;
            normals[i0].y = -diff.x;
        }

        /* add vertices + indexes */
        for (i0 = points_count-1, i1 = 0; i1 < points_count; i0 = i1++) {
            const struct nk_vec2 uv = list->config.null.uv;
            struct nk_vec2 n0 = normals[i0];
            struct nk_vec2 n1 = normals[i1];
            struct nk_vec2 dm = nk_vec2_muls(nk_vec2_add(n0, n1), 0.5f);
            float dmr2 = dm.x*dm.x + dm.y*dm.y;
            if (dmr2 > 0.000001f) {
                float scale = 1.0f / dmr2;
                scale = NK_MIN(scale, 100.0f);
                dm = nk_vec2_muls(dm, scale);
            }
            dm = nk_vec2_muls(dm, AA_SIZE * 0.5f);

            /* add vertices */
            vtx = nk_draw_vertex(vtx, &list->config, nk_vec2_sub(points[i1], dm), uv, col);
            vtx = nk_draw_vertex(vtx, &list->config, nk_vec2_add(points[i1], dm), uv, col_trans);

            /* add indexes */
            ids[0] = (nk_draw_index)(vtx_inner_idx+(i1<<1));
            ids[1] = (nk_draw_index)(vtx_inner_idx+(i0<<1));
            ids[2] = (nk_draw_index)(vtx_outer_idx+(i0<<1));
            ids[3] = (nk_draw_index)(vtx_outer_idx+(i0<<1));
            ids[4] = (nk_draw_index)(vtx_outer_idx+(i1<<1));
            ids[5] = (nk_draw_index)(vtx_inner_idx+(i1<<1));
            ids += 6;
        }
        /* free temporary normals + points */
        nk_buffer_reset(list->vertices, NK_BUFFER_FRONT);
    } else {
        nk_size i = 0;
        nk_size index = list->vertex_count;
        const nk_size idx_count = (points_count-2)*3;
        const nk_size vtx_count = points_count;
        void *vtx = nk_draw_list_alloc_vertices(list, vtx_count);
        nk_draw_index *ids = nk_draw_list_alloc_elements(list, idx_count);

        if (!vtx || !ids) return;
        for (i = 0; i < vtx_count; ++i)
            vtx = nk_draw_vertex(vtx, &list->config, points[i], list->config.null.uv, col);
        for (i = 2; i < points_count; ++i) {
            ids[0] = (nk_draw_index)index;
            ids[1] = (nk_draw_index)(index+ i - 1);
            ids[2] = (nk_draw_index)(index+i);
            ids += 3;
        }
    }
}